

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slghpattern.cc
# Opt level: O1

Pattern * __thiscall OrPattern::doOr(OrPattern *this,Pattern *b,int4 sa)

{
  int iVar1;
  long lVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  OrPattern *this_00;
  undefined8 *puVar3;
  ulong uVar4;
  pointer ppDVar5;
  vector<DisjointPattern_*,_std::allocator<DisjointPattern_*>_> newlist;
  vector<DisjointPattern_*,_std::allocator<DisjointPattern_*>_> local_58;
  DisjointPattern *local_40;
  Pattern *local_38;
  
  local_38 = b;
  if (b == (Pattern *)0x0) {
    lVar2 = 0;
  }
  else {
    lVar2 = __dynamic_cast(b,&Pattern::typeinfo,&typeinfo,0);
  }
  local_58.super__Vector_base<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>._M_impl.
  super__Vector_impl_data._M_start = (DisjointPattern **)0x0;
  local_58.super__Vector_base<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (DisjointPattern **)0x0;
  local_58.super__Vector_base<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (DisjointPattern **)0x0;
  ppDVar5 = (this->orlist).super__Vector_base<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppDVar5 !=
      (this->orlist).super__Vector_base<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    do {
      iVar1 = (*((*ppDVar5)->super_Pattern)._vptr_Pattern[2])();
      local_40 = (DisjointPattern *)CONCAT44(extraout_var,iVar1);
      if (local_58.super__Vector_base<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>._M_impl
          .super__Vector_impl_data._M_finish ==
          local_58.super__Vector_base<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>._M_impl
          .super__Vector_impl_data._M_end_of_storage) {
        std::vector<DisjointPattern*,std::allocator<DisjointPattern*>>::
        _M_realloc_insert<DisjointPattern*>
                  ((vector<DisjointPattern*,std::allocator<DisjointPattern*>> *)&local_58,
                   (iterator)
                   local_58.
                   super__Vector_base<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>._M_impl
                   .super__Vector_impl_data._M_finish,&local_40);
      }
      else {
        *local_58.super__Vector_base<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>._M_impl.
         super__Vector_impl_data._M_finish = local_40;
        local_58.super__Vector_base<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_58.super__Vector_base<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>.
             _M_impl.super__Vector_impl_data._M_finish + 1;
      }
      ppDVar5 = ppDVar5 + 1;
    } while (ppDVar5 !=
             (this->orlist).
             super__Vector_base<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  if ((sa < 0) &&
     (ppDVar5 = (this->orlist).
                super__Vector_base<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>._M_impl.
                super__Vector_impl_data._M_start,
     ppDVar5 !=
     (this->orlist).super__Vector_base<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>.
     _M_impl.super__Vector_impl_data._M_finish)) {
    do {
      (*((*ppDVar5)->super_Pattern)._vptr_Pattern[3])(*ppDVar5,(ulong)(uint)-sa);
      ppDVar5 = ppDVar5 + 1;
    } while (ppDVar5 !=
             (this->orlist).
             super__Vector_base<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  if (lVar2 == 0) {
    iVar1 = (*local_38->_vptr_Pattern[2])();
    local_40 = (DisjointPattern *)CONCAT44(extraout_var_00,iVar1);
    if (local_58.super__Vector_base<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_58.super__Vector_base<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<DisjointPattern*,std::allocator<DisjointPattern*>>::
      _M_realloc_insert<DisjointPattern*>
                ((vector<DisjointPattern*,std::allocator<DisjointPattern*>> *)&local_58,
                 (iterator)
                 local_58.super__Vector_base<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish,&local_40);
    }
    else {
      *local_58.super__Vector_base<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>._M_impl.
       super__Vector_impl_data._M_finish = local_40;
      local_58.super__Vector_base<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_58.super__Vector_base<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1;
    }
  }
  else {
    puVar3 = *(undefined8 **)(lVar2 + 8);
    if (puVar3 != *(undefined8 **)(lVar2 + 0x10)) {
      do {
        local_40 = (DisjointPattern *)(**(code **)(*(long *)*puVar3 + 0x10))();
        if (local_58.super__Vector_base<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>.
            _M_impl.super__Vector_impl_data._M_finish ==
            local_58.super__Vector_base<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<DisjointPattern*,std::allocator<DisjointPattern*>>::
          _M_realloc_insert<DisjointPattern*>
                    ((vector<DisjointPattern*,std::allocator<DisjointPattern*>> *)&local_58,
                     (iterator)
                     local_58.
                     super__Vector_base<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish,&local_40);
        }
        else {
          *local_58.super__Vector_base<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>.
           _M_impl.super__Vector_impl_data._M_finish = local_40;
          local_58.super__Vector_base<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>._M_impl
          .super__Vector_impl_data._M_finish =
               local_58.super__Vector_base<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>.
               _M_impl.super__Vector_impl_data._M_finish + 1;
        }
        puVar3 = puVar3 + 1;
      } while (puVar3 != *(undefined8 **)(lVar2 + 0x10));
    }
  }
  if ((0 < sa) &&
     (local_58.super__Vector_base<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_58.super__Vector_base<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>._M_impl.
      super__Vector_impl_data._M_start)) {
    uVar4 = 0;
    do {
      (*(local_58.super__Vector_base<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>._M_impl.
         super__Vector_impl_data._M_start[uVar4]->super_Pattern)._vptr_Pattern[3])
                (local_58.super__Vector_base<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar4],(ulong)(uint)sa);
      uVar4 = uVar4 + 1;
    } while (uVar4 < (ulong)((long)local_58.
                                   super__Vector_base<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_58.
                                   super__Vector_base<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  this_00 = (OrPattern *)operator_new(0x20);
  OrPattern(this_00,&local_58);
  if (local_58.super__Vector_base<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>._M_impl.
      super__Vector_impl_data._M_start != (DisjointPattern **)0x0) {
    operator_delete(local_58.
                    super__Vector_base<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return &this_00->super_Pattern;
}

Assistant:

Pattern *OrPattern::doOr(const Pattern *b,int4 sa) const

{
  const OrPattern *b2 = dynamic_cast<const OrPattern *>(b);
  vector<DisjointPattern *> newlist;
  vector<DisjointPattern *>::const_iterator iter;

  for(iter=orlist.begin();iter!=orlist.end();++iter)
    newlist.push_back((DisjointPattern *)(*iter)->simplifyClone());
  if (sa < 0)
    for(iter=orlist.begin();iter!=orlist.end();++iter)
      (*iter)->shiftInstruction(-sa);

  if (b2 == (const OrPattern *)0)
    newlist.push_back((DisjointPattern *)b->simplifyClone());
  else {
    for(iter=b2->orlist.begin();iter!=b2->orlist.end();++iter)
      newlist.push_back((DisjointPattern *)(*iter)->simplifyClone());
  }
  if (sa > 0)
    for(int4 i=0;i<newlist.size();++i)
      newlist[i]->shiftInstruction(sa);

  OrPattern *tmpor = new OrPattern(newlist);
  return tmpor;
}